

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O1

bool tinyusdz::detail::ParseMaterialXValue<std::__cxx11::string>
               (string *str,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
               ,string *err)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  StreamReader sr;
  AsciiParser parser;
  string local_538;
  StreamReader local_518;
  AsciiParser local_4f8;
  
  local_518.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
  local_518.length_ = str->_M_string_length;
  local_518.swap_endian_ = false;
  local_518.idx_ = 0;
  ascii::AsciiParser::AsciiParser(&local_4f8,&local_518);
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  bVar1 = ParseValue<std::__cxx11::string>(&local_4f8,&local_538,err);
  if (bVar1) {
    ::std::__cxx11::string::_M_assign((string *)value);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  ascii::AsciiParser::~AsciiParser(&local_4f8);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}